

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mipmap.cpp
# Opt level: O1

void __thiscall
pbrt::MIPMap::MIPMap
          (MIPMap *this,Image *image,RGBColorSpace *colorSpace,WrapMode wrapMode,Allocator alloc,
          MIPMapFilterOptions *options)

{
  size_t sVar1;
  byte bVar2;
  bool bVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  ulong uVar6;
  memory_resource *pmVar7;
  Image *pIVar8;
  WrapMode2D wrapMode_00;
  ulong uVar9;
  Image **ppIVar10;
  long in_FS_OFFSET;
  undefined1 auVar11 [32];
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [64];
  undefined1 auVar15 [64];
  undefined1 auVar17 [64];
  undefined1 auVar18 [64];
  vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_> vStack_e8;
  undefined1 local_c8 [40];
  size_t local_a0;
  ColorEncodingHandle local_98;
  undefined1 auStack_90 [24];
  size_t local_78;
  undefined1 local_70 [24];
  size_t local_58;
  undefined1 local_50 [24];
  size_t local_38;
  undefined1 auVar16 [64];
  
  pmVar7 = pstd::pmr::new_delete_resource();
  (this->pyramid).alloc.memoryResource = pmVar7;
  (this->pyramid).ptr = (Image *)0x0;
  (this->pyramid).nAlloc = 0;
  (this->pyramid).nStored = 0;
  this->colorSpace = colorSpace;
  this->wrapMode = wrapMode;
  this->options = *options;
  if (colorSpace == (RGBColorSpace *)0x0) {
    LogFatal<char_const(&)[22]>
              (Fatal,
               "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/mipmap.cpp"
               ,0xc4,"Check failed: %s",(char (*) [22])"colorSpace != nullptr");
  }
  local_c8._0_4_ = image->format;
  local_c8._4_4_ = (image->resolution).super_Tuple2<pbrt::Point2,_int>.x;
  local_c8._8_4_ = (image->resolution).super_Tuple2<pbrt::Point2,_int>.y;
  local_c8._16_8_ = (image->channelNames).alloc.memoryResource;
  local_c8._24_8_ = (image->channelNames).ptr;
  local_c8._32_8_ = (image->channelNames).nAlloc;
  local_a0 = (image->channelNames).nStored;
  (image->channelNames).nStored = 0;
  (image->channelNames).ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  (image->channelNames).nAlloc = 0;
  local_98.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )(image->encoding).
           super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
           .bits;
  auStack_90._0_8_ = (image->p8).alloc.memoryResource;
  local_78 = (image->p8).nStored;
  auStack_90._8_8_ = (image->p8).ptr;
  auStack_90._16_8_ = (image->p8).nAlloc;
  (image->p8).nStored = 0;
  (image->p8).ptr = (uchar *)0x0;
  (image->p8).nAlloc = 0;
  local_70._0_8_ = (image->p16).alloc.memoryResource;
  local_58 = (image->p16).nStored;
  local_70._8_8_ = (image->p16).ptr;
  local_70._16_8_ = (image->p16).nAlloc;
  (image->p16).nStored = 0;
  (image->p16).ptr = (Half *)0x0;
  (image->p16).nAlloc = 0;
  local_50._0_8_ = (image->p32).alloc.memoryResource;
  local_38 = (image->p32).nStored;
  local_50._8_8_ = (image->p32).ptr;
  local_50._16_8_ = (image->p32).nAlloc;
  (image->p32).nStored = 0;
  (image->p32).ptr = (float *)0x0;
  (image->p32).nAlloc = 0;
  wrapMode_00.wrap.values[1] = wrapMode;
  wrapMode_00.wrap.values[0] = wrapMode;
  Image::GeneratePyramid(&vStack_e8,(Image *)local_c8,wrapMode_00,alloc);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::operator=
            (&this->pyramid,&vStack_e8);
  pstd::vector<pbrt::Image,_pstd::pmr::polymorphic_allocator<pbrt::Image>_>::~vector(&vStack_e8);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector
            ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)local_50);
  pstd::vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_>::~vector
            ((vector<pbrt::Half,_pstd::pmr::polymorphic_allocator<pbrt::Half>_> *)local_70);
  pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)auStack_90);
  pstd::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_c8 + 0x10));
  sVar1 = (this->pyramid).nStored;
  if (sVar1 != 0) {
    ppIVar10 = &(this->pyramid).ptr;
    pIVar8 = *ppIVar10;
    auVar12 = vpbroadcastq_avx512f();
    auVar18 = ZEXT864(*(ulong *)(in_FS_OFFSET + -0x1b0));
    auVar12 = vpsrlq_avx512f(auVar12,7);
    uVar9 = 0;
    auVar13 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    vpmovsxwd_avx2(_DAT_02c90a60);
    vpmovsxwd_avx2(_DAT_02c90a70);
    vpmovsxwd_avx2(_DAT_02c90a80);
    do {
      auVar14 = vmovdqa64_avx512f(auVar18);
      auVar18 = vpbroadcastq_avx512f();
      auVar18 = vporq_avx512f(auVar18,auVar13);
      uVar6 = vpcmpuq_avx512f(auVar18,auVar12,2);
      auVar18 = vpgatherdq_avx512f(*(undefined4 *)((long)&(pIVar8->p8).nStored + uVar9));
      bVar2 = (byte)uVar6;
      auVar17._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
      auVar17._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar17._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
      auVar17._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
      auVar17._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
      auVar17._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
      auVar17._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
      auVar17._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
      auVar18 = vpgatherdq_avx512f(*(undefined4 *)((long)ppIVar10 + (long)pIVar8));
      auVar15._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar18._8_8_;
      auVar15._0_8_ = (ulong)(bVar2 & 1) * auVar18._0_8_;
      auVar15._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar18._16_8_;
      auVar15._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar18._24_8_;
      auVar15._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar18._32_8_;
      auVar15._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar18._40_8_;
      auVar15._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar18._48_8_;
      auVar15._56_8_ = (uVar6 >> 7) * auVar18._56_8_;
      auVar18 = vpaddq_avx512f(auVar15,auVar15);
      auVar15 = vpgatherdq_avx512f(*(undefined4 *)((long)&pIVar8->format + (ulong)wrapMode));
      auVar16._8_8_ = (ulong)((byte)(uVar6 >> 1) & 1) * auVar15._8_8_;
      auVar16._0_8_ = (ulong)(bVar2 & 1) * auVar15._0_8_;
      auVar16._16_8_ = (ulong)((byte)(uVar6 >> 2) & 1) * auVar15._16_8_;
      auVar16._24_8_ = (ulong)((byte)(uVar6 >> 3) & 1) * auVar15._24_8_;
      auVar16._32_8_ = (ulong)((byte)(uVar6 >> 4) & 1) * auVar15._32_8_;
      auVar16._40_8_ = (ulong)((byte)(uVar6 >> 5) & 1) * auVar15._40_8_;
      auVar16._48_8_ = (ulong)((byte)(uVar6 >> 6) & 1) * auVar15._48_8_;
      auVar16._56_8_ = (uVar6 >> 7) * auVar15._56_8_;
      auVar15 = vpsllq_avx512f(auVar16,2);
      auVar17 = vpaddq_avx512f(auVar17,auVar14);
      auVar18 = vpaddq_avx512f(auVar17,auVar18);
      auVar18 = vpaddq_avx512f(auVar18,auVar15);
      uVar9 = uVar9 + 8;
      pIVar8 = pIVar8 + 8;
    } while (((sVar1 * 0x98 - 0x98) / 0x98 + 8 & 0xfffffffffffffff8) != uVar9);
    auVar12 = vmovdqa64_avx512f(auVar18);
    auVar13._0_8_ = (ulong)(bVar2 & 1) * auVar12._0_8_ | (ulong)!(bool)(bVar2 & 1) * auVar14._0_8_;
    bVar3 = (bool)((byte)(uVar6 >> 1) & 1);
    auVar13._8_8_ = (ulong)bVar3 * auVar12._8_8_ | (ulong)!bVar3 * auVar14._8_8_;
    bVar3 = (bool)((byte)(uVar6 >> 2) & 1);
    auVar13._16_8_ = (ulong)bVar3 * auVar12._16_8_ | (ulong)!bVar3 * auVar14._16_8_;
    bVar3 = (bool)((byte)(uVar6 >> 3) & 1);
    auVar13._24_8_ = (ulong)bVar3 * auVar12._24_8_ | (ulong)!bVar3 * auVar14._24_8_;
    bVar3 = (bool)((byte)(uVar6 >> 4) & 1);
    auVar13._32_8_ = (ulong)bVar3 * auVar12._32_8_ | (ulong)!bVar3 * auVar14._32_8_;
    bVar3 = (bool)((byte)(uVar6 >> 5) & 1);
    auVar13._40_8_ = (ulong)bVar3 * auVar12._40_8_ | (ulong)!bVar3 * auVar14._40_8_;
    bVar3 = (bool)((byte)(uVar6 >> 6) & 1);
    auVar13._48_8_ = (ulong)bVar3 * auVar12._48_8_ | (ulong)!bVar3 * auVar14._48_8_;
    auVar13._56_8_ = (uVar6 >> 7) * auVar12._56_8_ | (ulong)!SUB81(uVar6 >> 7,0) * auVar14._56_8_;
    auVar11 = vextracti64x4_avx512f(auVar13,1);
    auVar12 = vpaddq_avx512f(auVar13,ZEXT3264(auVar11));
    auVar4 = vpaddq_avx(auVar12._0_16_,auVar12._16_16_);
    auVar5 = vpshufd_avx(auVar4,0xee);
    auVar4 = vpaddq_avx(auVar4,auVar5);
    *(long *)(in_FS_OFFSET + -0x1b0) = auVar4._0_8_;
  }
  return;
}

Assistant:

MIPMap::MIPMap(Image image, const RGBColorSpace *colorSpace, WrapMode wrapMode,
               Allocator alloc, const MIPMapFilterOptions &options)
    : colorSpace(colorSpace), wrapMode(wrapMode), options(options) {
    CHECK(colorSpace != nullptr);
    pyramid = Image::GeneratePyramid(std::move(image), wrapMode, alloc);
    std::for_each(pyramid.begin(), pyramid.end(),
                  [](const Image &im) { imageMapBytes += im.BytesUsed(); });
}